

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

int64 __thiscall TTD::EventLog::GetPreviousSnapshotInterval(EventLog *this,int64 currentSnapTime)

{
  EventLogEntry *pEVar1;
  SnapshotEventLogEntry *pSVar2;
  undefined1 local_40 [8];
  Iterator iter;
  
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)local_40,&this->m_eventList);
  while (((local_40 != (undefined1  [8])0x0 &&
          (*(TTEventListLink **)((long)local_40 + 8) <= iter.m_currLink)) &&
         (iter.m_currLink < (TTEventListLink *)*(size_t *)local_40))) {
    pEVar1 = TTEventList::Iterator::Current((Iterator *)local_40);
    if (pEVar1->EventKind == SnapshotTag) {
      pEVar1 = TTEventList::Iterator::Current((Iterator *)local_40);
      pSVar2 = NSLogEvents::
               GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                         (pEVar1);
      if (pSVar2->RestoreTimestamp < currentSnapTime) {
        return pSVar2->RestoreTimestamp;
      }
    }
    TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)local_40);
  }
  return -1;
}

Assistant:

int64 EventLog::GetPreviousSnapshotInterval(int64 currentSnapTime) const
    {
        //move the iterator to the current snapshot just before the event
        for(auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly(); iter.IsValid(); iter.MovePrevious_ReplayOnly())
        {
            NSLogEvents::EventLogEntry* evt = iter.Current();
            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                if(snapEvent->RestoreTimestamp < currentSnapTime)
                {
                    return snapEvent->RestoreTimestamp;
                }
            }
        }

        return -1;
    }